

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QGraphicsWidget * __thiscall QGraphicsItem::topLevelWidget(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItem *pQVar2;
  QGraphicsWidget *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem *pQVar5;
  
  pQVar1 = (this->d_ptr).d;
  pQVar5 = (QGraphicsItem *)0x0;
  pQVar4 = pQVar1;
  do {
    pQVar2 = pQVar4->parent;
    if (pQVar2 == (QGraphicsItem *)0x0) goto LAB_005e74a2;
    pQVar4 = (pQVar2->d_ptr).d;
  } while ((pQVar4->field_0x163 & 1) == 0);
  pQVar5 = pQVar2 + -1;
LAB_005e74a2:
  if (pQVar5 == (QGraphicsItem *)0x0) {
    pQVar3 = (QGraphicsWidget *)
             ((ulong)(this + -1) & (*(long *)&pQVar1->field_0x160 << 0x27) >> 0x3f);
  }
  else {
    pQVar3 = topLevelWidget(pQVar5 + 1);
  }
  return pQVar3;
}

Assistant:

QGraphicsWidget *QGraphicsItem::topLevelWidget() const
{
    if (const QGraphicsWidget *p = parentWidget())
        return p->topLevelWidget();
    return isWidget() ? static_cast<QGraphicsWidget *>(const_cast<QGraphicsItem *>(this)) : nullptr;
}